

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
memory::
Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>::
Array<std::allocator<int>>
          (Array<int,memory::HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>>
           *this,vector<int,_std::allocator<int>_> *other)

{
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_> local_31;
  view_type local_30;
  
  HostCoordinator<int,_memory::Allocator<int,_memory::impl::AlignedPolicy<8UL>_>_>::allocate
            (&local_30,&local_31,
             (long)(other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  *(pointer *)(this + 8) = local_30.pointer_;
  *(size_type *)(this + 0x10) = local_30.size_;
  local_30.pointer_ =
       (other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_30.size_ =
       (long)(other->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish - (long)local_30.pointer_ >> 2;
  HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>::
  copy<memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>>
            ((HostCoordinator<int,memory::Allocator<int,memory::impl::AlignedPolicy<8ul>>> *)
             (this + 0x18),
             (ConstArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
              *)&local_30,
             (ArrayView<value_type,_HostCoordinator<value_type,_Allocator<int,_AlignedPolicy<8UL>_>_>_>
              *)this);
  return;
}

Assistant:

Array(std::vector<value_type, Allocator> const& other)
    : base(coordinator_type().allocate(other.size()))
    {
        coordinator_.copy(
            const_view_type(other.data(), other.size()),
            *this
        );
    }